

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

Type __thiscall
wabt::anon_unknown_4::Validator::GetDeclarationType(Validator *this,FuncDeclaration *decl)

{
  pointer pTVar1;
  pointer pTVar2;
  Enum EVar3;
  
  if (decl->has_func_type == true) {
    if ((decl->type_var).type_ == Index) {
      return (Type)(decl->type_var).field_2.index_;
    }
    __assert_fail("is_index()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/ir.h",
                  0x38,"Index wabt::Var::index() const");
  }
  if ((decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pTVar1 = (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar2 = (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar1 == pTVar2) {
      return (Type)Void;
    }
    if ((long)pTVar2 - (long)pTVar1 == 4) {
      return (Type)pTVar1->enum_;
    }
  }
  if (decl->has_func_type == true) {
    EVar3 = BindingHash::FindIndex
                      ((BindingHash *)
                       &(this->validator_).init_expr_funcs_.
                        super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
                        super__Vector_impl_data._M_finish,&decl->type_var);
    return (Type)EVar3;
  }
  EVar3 = Module::GetFuncTypeIndex((Module *)this,&decl->sig);
  return (Type)EVar3;
}

Assistant:

Type Validator::GetDeclarationType(const FuncDeclaration& decl) {
  if (decl.has_func_type) {
    return Type(decl.type_var.index());
  }
  if (decl.sig.param_types.empty()) {
    if (decl.sig.result_types.empty()) {
      return Type::Void;
    }
    if (decl.sig.result_types.size() == 1) {
      return decl.sig.result_types[0];
    }
  }
  return Type(current_module_->GetFuncTypeIndex(decl));
}